

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<vkb::Instance> * __thiscall
vkb::InstanceBuilder::build(Result<vkb::Instance> *__return_storage_ptr__,InstanceBuilder *this)

{
  PFN_vkEnumerateInstanceVersion p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  VkResult VVar6;
  SystemInfo *pSVar7;
  VulkanFunctions *pVVar8;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar9;
  reference __x;
  size_type sVar10;
  vector<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_> *this_00;
  vector<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_> *this_01;
  vector<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_> *this_02;
  error_code eVar11;
  error_code error_code;
  error_code error_code_00;
  error_code error_code_01;
  error_code error_code_02;
  error_code error_code_03;
  error_code error_code_04;
  error_code error_code_05;
  error_code error_code_06;
  error_code error_code_07;
  error_code error_code_08;
  error_code error_code_09;
  bool local_427;
  bool local_425;
  bool local_421;
  uint local_410;
  error_code local_3c8;
  error_code local_3b8;
  VkResult local_3a4;
  undefined1 auStack_3a0 [4];
  VkResult res;
  Instance instance;
  VkBaseOutStructure **node;
  iterator __end1_2;
  iterator __begin1_2;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *__range1_2;
  VkInstanceCreateInfo instance_create_info;
  char *local_300;
  VkValidationFlagsEXT checks;
  VkValidationCheckEXT local_2d8 [2];
  VkValidationFeaturesEXT features;
  VkValidationFeatureDisableEXT local_2a0 [2];
  VkDebugUtilsMessengerCreateInfoEXT messengerCreateInfo;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> pNext_chain;
  bool all_layers_supported;
  char **layer;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1_1;
  bool all_extensions_supported;
  undefined1 auStack_1f0 [6];
  bool added_window_exts;
  bool khr_surface_added;
  anon_class_16_2_8af7eade check_add_window_ext;
  char *pcStack_1d0;
  bool portability_enumeration_support;
  bool local_1c1;
  char *pcStack_1c0;
  bool properties2_ext_enabled;
  reference local_1b8;
  char **ext;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  vector<const_char_*,_std::allocator<const_char_*>_> layers;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions;
  VkApplicationInfo app_info;
  uint32_t api_version;
  VkResult res_1;
  PFN_vkEnumerateInstanceVersion pfn_vkEnumerateInstanceVersion;
  undefined1 local_b8 [4];
  uint32_t instance_version;
  SystemInfo system;
  undefined1 local_58 [8];
  Result<vkb::SystemInfo> sys_info_ret;
  InstanceBuilder *this_local;
  
  sys_info_ret._56_8_ = this;
  SystemInfo::get_system_info
            ((Result<vkb::SystemInfo> *)local_58,(this->info).fp_vkGetInstanceProcAddr);
  bVar2 = vkb::Result::operator_cast_to_bool((Result *)local_58);
  if (!bVar2) {
    eVar11 = Result<vkb::SystemInfo>::error((Result<vkb::SystemInfo> *)local_58);
    error_code._M_cat = eVar11._M_cat;
    error_code._4_4_ = 0;
    error_code._M_value = eVar11._M_value;
    Result<vkb::Instance>::Result(__return_storage_ptr__,error_code,VK_SUCCESS);
    system.instance_api_version = 1;
    goto LAB_0010ff7e;
  }
  pSVar7 = Result<vkb::SystemInfo>::value((Result<vkb::SystemInfo> *)local_58);
  SystemInfo::SystemInfo((SystemInfo *)local_b8,pSVar7);
  pfn_vkEnumerateInstanceVersion._4_4_ = 0x400000;
  if (((this->info).minimum_instance_version < 0x400001) &&
     ((this->info).required_api_version < 0x400001)) {
LAB_0010f3cc:
    if (pfn_vkEnumerateInstanceVersion._4_4_ < 0x401000) {
      local_410 = pfn_vkEnumerateInstanceVersion._4_4_;
    }
    else {
      local_410 = (this->info).required_api_version;
    }
    memset(&extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage,0,0x30);
    extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               &layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    pvVar9 = &(this->info).extensions;
    __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(pvVar9);
    ext = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(pvVar9);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                       *)&ext), bVar2) {
      local_1b8 = __gnu_cxx::
                  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                  ::operator*(&__end1);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 &layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_1b8);
      __gnu_cxx::
      __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
      ::operator++(&__end1);
    }
    if ((((this->info).debug_callback != (PFN_vkDebugUtilsMessengerCallbackEXT)0x0) &&
        (((this->info).use_debug_messenger & 1U) != 0)) &&
       ((system.available_extensions.
         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._1_1_ & 1) != 0)) {
      pcStack_1c0 = "VK_EXT_debug_utils";
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 &layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffe40);
    }
    local_421 = false;
    if (local_410 < 0x401000) {
      local_421 = detail::check_extension_supported
                            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                              *)&system.available_layers.
                                 super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             "VK_KHR_get_physical_device_properties2");
    }
    local_1c1 = local_421;
    if (local_421 != false) {
      pcStack_1d0 = "VK_KHR_get_physical_device_properties2";
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 &layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffe30);
    }
    bVar2 = detail::check_extension_supported
                      ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                       &system.available_layers.
                        super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       "VK_KHR_portability_enumeration");
    if (bVar2) {
      check_add_window_ext.extensions =
           (vector<const_char_*,_std::allocator<const_char_*>_> *)anon_var_dwarf_4d38f;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                 &layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type *)&check_add_window_ext.extensions);
    }
    if (((this->info).headless_context & 1U) == 0) {
      _auStack_1f0 = (SystemInfo *)local_b8;
      check_add_window_ext.system =
           (SystemInfo *)
           &layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      bVar3 = build::anon_class_16_2_8af7eade::operator()
                        ((anon_class_16_2_8af7eade *)auStack_1f0,"VK_KHR_surface");
      bVar4 = build::anon_class_16_2_8af7eade::operator()
                        ((anon_class_16_2_8af7eade *)auStack_1f0,"VK_KHR_xcb_surface");
      bVar5 = build::anon_class_16_2_8af7eade::operator()
                        ((anon_class_16_2_8af7eade *)auStack_1f0,"VK_KHR_xlib_surface");
      local_425 = true;
      if (!bVar5) {
        local_425 = bVar4;
      }
      bVar4 = build::anon_class_16_2_8af7eade::operator()
                        ((anon_class_16_2_8af7eade *)auStack_1f0,"VK_KHR_wayland_surface");
      local_427 = true;
      if (!bVar4) {
        local_427 = local_425;
      }
      if ((bVar3) && (local_427 != false)) goto LAB_0010f7ea;
      eVar11 = make_error_code(windowing_extensions_not_present);
      error_code_06._M_cat = eVar11._M_cat;
      error_code_06._4_4_ = 0;
      error_code_06._M_value = eVar11._M_value;
      Result<vkb::Instance>::Result(__return_storage_ptr__,error_code_06,VK_SUCCESS);
      system.instance_api_version = 1;
    }
    else {
LAB_0010f7ea:
      bVar3 = detail::check_extensions_supported
                        ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                         &system.available_layers.
                          super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<const_char_*,_std::allocator<const_char_*>_> *)
                         &layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar3) {
        pvVar9 = &(this->info).layers;
        __end1_1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(pvVar9);
        layer = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(pvVar9);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end1_1,
                                  (__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                   *)&layer), bVar3) {
          __x = __gnu_cxx::
                __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&__end1_1);
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,__x);
          __gnu_cxx::
          __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
          ::operator++(&__end1_1);
        }
        if ((((this->info).enable_validation_layers & 1U) != 0) ||
           ((((this->info).request_validation_layers & 1U) != 0 &&
            (((byte)system.available_extensions.
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0)))) {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,
                     &detail::validation_layer_name);
        }
        bVar3 = detail::check_layers_supported
                          ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)local_b8
                           ,(vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
        if (bVar3) {
          std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::vector
                    ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                     &messengerCreateInfo.pUserData);
          memset(local_2a0,0,0x30);
          if (((this->info).use_debug_messenger & 1U) != 0) {
            local_2a0[0] = 0x3b9cbe04;
            messengerCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
            messengerCreateInfo._4_4_ = 0;
            messengerCreateInfo.pNext._4_4_ = (this->info).debug_message_severity;
            messengerCreateInfo.flags = (this->info).debug_message_type;
            messengerCreateInfo._24_8_ = (this->info).debug_callback;
            messengerCreateInfo.pfnUserCallback =
                 (PFN_vkDebugUtilsMessengerCallbackEXT)(this->info).debug_user_data_pointer;
            features.pDisabledValidationFeatures = local_2a0;
            std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::push_back
                      ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                       &messengerCreateInfo.pUserData,
                       (value_type *)&features.pDisabledValidationFeatures);
          }
          memset(local_2d8,0,0x30);
          sVar10 = std::
                   vector<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                   ::size(&(this->info).enabled_validation_features);
          if ((sVar10 != 0) ||
             (sVar10 = std::
                       vector<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                       ::size(&(this->info).disabled_validation_features), sVar10 != 0)) {
            local_2d8[0] = 0x3b9e8ed8;
            features.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
            features._4_4_ = 0;
            this_00 = &(this->info).enabled_validation_features;
            sVar10 = std::
                     vector<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                     ::size(this_00);
            features.pNext._0_4_ = (undefined4)sVar10;
            features._16_8_ =
                 std::
                 vector<VkValidationFeatureEnableEXT,_std::allocator<VkValidationFeatureEnableEXT>_>
                 ::data(this_00);
            this_01 = &(this->info).disabled_validation_features;
            sVar10 = std::
                     vector<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                     ::size(this_01);
            features.pEnabledValidationFeatures._0_4_ = (undefined4)sVar10;
            features._32_8_ =
                 std::
                 vector<VkValidationFeatureDisableEXT,_std::allocator<VkValidationFeatureDisableEXT>_>
                 ::data(this_01);
            checks.pDisabledValidationChecks = local_2d8;
            std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::push_back
                      ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                       &messengerCreateInfo.pUserData,
                       (value_type *)&checks.pDisabledValidationChecks);
          }
          memset(&local_300,0,0x20);
          sVar10 = std::vector<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>::size
                             (&(this->info).disabled_validation_checks);
          if (sVar10 != 0) {
            local_300._0_4_ = 0x3b9bb848;
            checks.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
            checks._4_4_ = 0;
            this_02 = &(this->info).disabled_validation_checks;
            sVar10 = std::vector<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>::size
                               (this_02);
            checks.pNext._0_4_ = (undefined4)sVar10;
            checks._16_8_ =
                 std::vector<VkValidationCheckEXT,_std::allocator<VkValidationCheckEXT>_>::data
                           (this_02);
            instance_create_info.ppEnabledExtensionNames = &local_300;
            std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::push_back
                      ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                       &messengerCreateInfo.pUserData,
                       (value_type *)&instance_create_info.ppEnabledExtensionNames);
          }
          instance_create_info.ppEnabledLayerNames = (char **)0x0;
          instance_create_info.enabledExtensionCount = 0;
          instance_create_info._52_4_ = 0;
          instance_create_info.pApplicationInfo = (VkApplicationInfo *)0x0;
          instance_create_info.enabledLayerCount = 0;
          instance_create_info._36_4_ = 0;
          instance_create_info.pNext = (void *)0x0;
          instance_create_info.flags = 0;
          instance_create_info._20_4_ = 0;
          instance_create_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          instance_create_info._4_4_ = 0;
          __range1_2 = (vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)0x1;
          detail::setup_pNext_chain<VkInstanceCreateInfo>
                    ((VkInstanceCreateInfo *)&__range1_2,
                     (vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                     &messengerCreateInfo.pUserData);
          __end1_2 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::begin
                               ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                                 *)&messengerCreateInfo.pUserData);
          node = (VkBaseOutStructure **)
                 std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::end
                           ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                            &messengerCreateInfo.pUserData);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end1_2,
                                    (__normal_iterator<VkBaseOutStructure_**,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
                                     *)&node), bVar3) {
            instance._48_8_ =
                 __gnu_cxx::
                 __normal_iterator<VkBaseOutStructure_**,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
                 ::operator*(&__end1_2);
            if ((*(VkBaseOutStructure **)instance._48_8_)->sType ==
                VK_STRUCTURE_TYPE_APPLICATION_INFO) {
              __assert_fail("node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO",
                            "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                            ,0x2ee,"Result<Instance> vkb::InstanceBuilder::build() const");
            }
            __gnu_cxx::
            __normal_iterator<VkBaseOutStructure_**,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
            ::operator++(&__end1_2);
          }
          instance_create_info.pNext =
               (void *)CONCAT44(instance_create_info.pNext._4_4_,(this->info).flags);
          instance_create_info._16_8_ =
               &extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
          sVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                             ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                              &layers.
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          instance_create_info.ppEnabledLayerNames =
               (char **)CONCAT44(instance_create_info.ppEnabledLayerNames._4_4_,(int)sVar10);
          instance_create_info._48_8_ =
               std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                          &layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
          sVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                             ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
          instance_create_info.pApplicationInfo =
               (VkApplicationInfo *)
               CONCAT44(instance_create_info.pApplicationInfo._4_4_,(int)sVar10);
          instance_create_info._32_8_ =
               std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
          if (bVar2) {
            instance_create_info.pNext = (void *)((ulong)instance_create_info.pNext | 1);
          }
          Instance::Instance((Instance *)auStack_3a0);
          pVVar8 = detail::vulkan_functions();
          local_3a4 = (*pVVar8->fp_vkCreateInstance)
                                ((VkInstanceCreateInfo *)&__range1_2,
                                 (this->info).allocation_callbacks,(VkInstance *)auStack_3a0);
          if (local_3a4 == VK_SUCCESS) {
            pVVar8 = detail::vulkan_functions();
            detail::VulkanFunctions::init_instance_funcs(pVVar8,_auStack_3a0);
            if ((((this->info).use_debug_messenger & 1U) == 0) ||
               (local_3a4 = create_debug_utils_messenger
                                      (_auStack_3a0,(this->info).debug_callback,
                                       (this->info).debug_message_severity,
                                       (this->info).debug_message_type,
                                       (this->info).debug_user_data_pointer,
                                       (VkDebugUtilsMessengerEXT *)&instance,
                                       (this->info).allocation_callbacks), local_3a4 == VK_SUCCESS))
            {
              instance.instance_version._0_1_ = (this->info).headless_context & 1;
              instance.instance_version._1_1_ = local_1c1 & 1;
              instance.debug_messenger = (VkDebugUtilsMessengerEXT)(this->info).allocation_callbacks
              ;
              instance.fp_vkGetDeviceProcAddr._0_4_ = pfn_vkEnumerateInstanceVersion._4_4_;
              instance.fp_vkGetDeviceProcAddr._4_4_ = local_410;
              pVVar8 = detail::vulkan_functions();
              instance.allocation_callbacks =
                   (VkAllocationCallbacks *)pVVar8->ptr_vkGetInstanceProcAddr;
              pVVar8 = detail::vulkan_functions();
              instance.fp_vkGetInstanceProcAddr =
                   (PFN_vkGetInstanceProcAddr)pVVar8->fp_vkGetDeviceProcAddr;
              Result<vkb::Instance>::Result(__return_storage_ptr__,(Instance *)auStack_3a0);
            }
            else {
              std::error_code::error_code<vkb::InstanceError,void>
                        (&local_3c8,failed_create_debug_messenger);
              eVar11._4_4_ = 0;
              eVar11._M_value = local_3c8._M_value;
              eVar11._M_cat = local_3c8._M_cat;
              Result<vkb::Instance>::Result(__return_storage_ptr__,eVar11,local_3a4);
            }
          }
          else {
            std::error_code::error_code<vkb::InstanceError,void>(&local_3b8,failed_create_instance);
            error_code_09._4_4_ = 0;
            error_code_09._M_value = local_3b8._M_value;
            error_code_09._M_cat = local_3b8._M_cat;
            Result<vkb::Instance>::Result(__return_storage_ptr__,error_code_09,local_3a4);
          }
          system.instance_api_version = 1;
          std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::~vector
                    ((vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)
                     &messengerCreateInfo.pUserData);
        }
        else {
          eVar11 = make_error_code(requested_layers_not_present);
          error_code_08._M_cat = eVar11._M_cat;
          error_code_08._4_4_ = 0;
          error_code_08._M_value = eVar11._M_value;
          Result<vkb::Instance>::Result(__return_storage_ptr__,error_code_08,VK_SUCCESS);
          system.instance_api_version = 1;
        }
      }
      else {
        eVar11 = make_error_code(requested_extensions_not_present);
        error_code_07._M_cat = eVar11._M_cat;
        error_code_07._4_4_ = 0;
        error_code_07._M_value = eVar11._M_value;
        Result<vkb::Instance>::Result(__return_storage_ptr__,error_code_07,VK_SUCCESS);
        system.instance_api_version = 1;
      }
    }
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               &layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    pVVar8 = detail::vulkan_functions();
    p_Var1 = pVVar8->fp_vkEnumerateInstanceVersion;
    if ((p_Var1 == (PFN_vkEnumerateInstanceVersion)0x0) ||
       ((VVar6 = (*p_Var1)((uint32_t *)((long)&pfn_vkEnumerateInstanceVersion + 4)),
        VVar6 == VK_SUCCESS || ((this->info).required_api_version == 0)))) {
      if ((p_Var1 != (PFN_vkEnumerateInstanceVersion)0x0) &&
         (((this->info).minimum_instance_version <= pfn_vkEnumerateInstanceVersion._4_4_ &&
          (((this->info).minimum_instance_version != 0 ||
           ((this->info).required_api_version <= pfn_vkEnumerateInstanceVersion._4_4_))))))
      goto LAB_0010f3cc;
      if (((this->info).required_api_version >> 0xc & 0x3ff) == 4) {
        eVar11 = make_error_code(vulkan_version_1_4_unavailable);
        error_code_01._M_cat = eVar11._M_cat;
        error_code_01._4_4_ = 0;
        error_code_01._M_value = eVar11._M_value;
        Result<vkb::Instance>::Result(__return_storage_ptr__,error_code_01,VK_SUCCESS);
        system.instance_api_version = 1;
      }
      else if (((this->info).required_api_version >> 0xc & 0x3ff) == 3) {
        eVar11 = make_error_code(vulkan_version_1_3_unavailable);
        error_code_02._M_cat = eVar11._M_cat;
        error_code_02._4_4_ = 0;
        error_code_02._M_value = eVar11._M_value;
        Result<vkb::Instance>::Result(__return_storage_ptr__,error_code_02,VK_SUCCESS);
        system.instance_api_version = 1;
      }
      else if (((this->info).required_api_version >> 0xc & 0x3ff) == 2) {
        eVar11 = make_error_code(vulkan_version_1_2_unavailable);
        error_code_03._M_cat = eVar11._M_cat;
        error_code_03._4_4_ = 0;
        error_code_03._M_value = eVar11._M_value;
        Result<vkb::Instance>::Result(__return_storage_ptr__,error_code_03,VK_SUCCESS);
        system.instance_api_version = 1;
      }
      else if (((this->info).required_api_version >> 0xc & 0x3ff) == 0) {
        eVar11 = make_error_code(vulkan_version_unavailable);
        error_code_05._M_cat = eVar11._M_cat;
        error_code_05._4_4_ = 0;
        error_code_05._M_value = eVar11._M_value;
        Result<vkb::Instance>::Result(__return_storage_ptr__,error_code_05,VK_SUCCESS);
        system.instance_api_version = 1;
      }
      else {
        eVar11 = make_error_code(vulkan_version_1_1_unavailable);
        error_code_04._M_cat = eVar11._M_cat;
        error_code_04._4_4_ = 0;
        error_code_04._M_value = eVar11._M_value;
        Result<vkb::Instance>::Result(__return_storage_ptr__,error_code_04,VK_SUCCESS);
        system.instance_api_version = 1;
      }
    }
    else {
      eVar11 = make_error_code(vulkan_version_unavailable);
      error_code_00._M_cat = eVar11._M_cat;
      error_code_00._4_4_ = 0;
      error_code_00._M_value = eVar11._M_value;
      Result<vkb::Instance>::Result(__return_storage_ptr__,error_code_00,VK_SUCCESS);
      system.instance_api_version = 1;
    }
  }
  SystemInfo::~SystemInfo((SystemInfo *)local_b8);
LAB_0010ff7e:
  Result<vkb::SystemInfo>::~Result((Result<vkb::SystemInfo> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Result<Instance> InstanceBuilder::build() const {

    auto sys_info_ret = SystemInfo::get_system_info(info.fp_vkGetInstanceProcAddr);
    if (!sys_info_ret) return sys_info_ret.error();
    auto system = sys_info_ret.value();

    uint32_t instance_version = VKB_VK_API_VERSION_1_0;

    if (info.minimum_instance_version > VKB_VK_API_VERSION_1_0 || info.required_api_version > VKB_VK_API_VERSION_1_0) {
        PFN_vkEnumerateInstanceVersion pfn_vkEnumerateInstanceVersion = detail::vulkan_functions().fp_vkEnumerateInstanceVersion;

        if (pfn_vkEnumerateInstanceVersion != nullptr) {
            VkResult res = pfn_vkEnumerateInstanceVersion(&instance_version);
            // Should always return VK_SUCCESS
            if (res != VK_SUCCESS && info.required_api_version > 0)
                return make_error_code(InstanceError::vulkan_version_unavailable);
        }
        if (pfn_vkEnumerateInstanceVersion == nullptr || instance_version < info.minimum_instance_version ||
            (info.minimum_instance_version == 0 && instance_version < info.required_api_version)) {
            if (VK_VERSION_MINOR(info.required_api_version) == 4)
                return make_error_code(InstanceError::vulkan_version_1_4_unavailable);
            else if (VK_VERSION_MINOR(info.required_api_version) == 3)
                return make_error_code(InstanceError::vulkan_version_1_3_unavailable);
            else if (VK_VERSION_MINOR(info.required_api_version) == 2)
                return make_error_code(InstanceError::vulkan_version_1_2_unavailable);
            else if (VK_VERSION_MINOR(info.required_api_version))
                return make_error_code(InstanceError::vulkan_version_1_1_unavailable);
            else
                return make_error_code(InstanceError::vulkan_version_unavailable);
        }
    }

    uint32_t api_version = instance_version < VKB_VK_API_VERSION_1_1 ? instance_version : info.required_api_version;

    VkApplicationInfo app_info = {};
    app_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    app_info.pNext = nullptr;
    app_info.pApplicationName = info.app_name != nullptr ? info.app_name : "";
    app_info.applicationVersion = info.application_version;
    app_info.pEngineName = info.engine_name != nullptr ? info.engine_name : "";
    app_info.engineVersion = info.engine_version;
    app_info.apiVersion = api_version;

    std::vector<const char*> extensions;
    std::vector<const char*> layers;

    for (auto& ext : info.extensions)
        extensions.push_back(ext);
    if (info.debug_callback != nullptr && info.use_debug_messenger && system.debug_utils_available) {
        extensions.push_back(VK_EXT_DEBUG_UTILS_EXTENSION_NAME);
    }
    bool properties2_ext_enabled =
        api_version < VKB_VK_API_VERSION_1_1 && detail::check_extension_supported(system.available_extensions,
                                                    VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);
    if (properties2_ext_enabled) {
        extensions.push_back(VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);
    }

#if defined(VK_KHR_portability_enumeration)
    bool portability_enumeration_support =
        detail::check_extension_supported(system.available_extensions, VK_KHR_PORTABILITY_ENUMERATION_EXTENSION_NAME);
    if (portability_enumeration_support) {
        extensions.push_back(VK_KHR_PORTABILITY_ENUMERATION_EXTENSION_NAME);
    }
#else
    bool portability_enumeration_support = false;
#endif
    if (!info.headless_context) {
        auto check_add_window_ext = [&](const char* name) -> bool {
            if (!detail::check_extension_supported(system.available_extensions, name)) return false;
            extensions.push_back(name);
            return true;
        };
        bool khr_surface_added = check_add_window_ext("VK_KHR_surface");
#if defined(_WIN32)
        bool added_window_exts = check_add_window_ext("VK_KHR_win32_surface");
#elif defined(__ANDROID__)
        bool added_window_exts = check_add_window_ext("VK_KHR_android_surface");
#elif defined(_DIRECT2DISPLAY)
        bool added_window_exts = check_add_window_ext("VK_KHR_display");
#elif defined(__linux__) || defined(__FreeBSD__)
        // make sure all three calls to check_add_window_ext, don't allow short circuiting
        bool added_window_exts = check_add_window_ext("VK_KHR_xcb_surface");
        added_window_exts = check_add_window_ext("VK_KHR_xlib_surface") || added_window_exts;
        added_window_exts = check_add_window_ext("VK_KHR_wayland_surface") || added_window_exts;
#elif defined(__APPLE__)
        bool added_window_exts = check_add_window_ext("VK_EXT_metal_surface");
#endif
        if (!khr_surface_added || !added_window_exts)
            return make_error_code(InstanceError::windowing_extensions_not_present);
    }
    bool all_extensions_supported = detail::check_extensions_supported(system.available_extensions, extensions);
    if (!all_extensions_supported) {
        return make_error_code(InstanceError::requested_extensions_not_present);
    }

    for (auto& layer : info.layers)
        layers.push_back(layer);

    if (info.enable_validation_layers || (info.request_validation_layers && system.validation_layers_available)) {
        layers.push_back(detail::validation_layer_name);
    }
    bool all_layers_supported = detail::check_layers_supported(system.available_layers, layers);
    if (!all_layers_supported) {
        return make_error_code(InstanceError::requested_layers_not_present);
    }

    std::vector<VkBaseOutStructure*> pNext_chain;

    VkDebugUtilsMessengerCreateInfoEXT messengerCreateInfo = {};
    if (info.use_debug_messenger) {
        messengerCreateInfo.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
        messengerCreateInfo.pNext = nullptr;
        messengerCreateInfo.messageSeverity = info.debug_message_severity;
        messengerCreateInfo.messageType = info.debug_message_type;
        messengerCreateInfo.pfnUserCallback = info.debug_callback;
        messengerCreateInfo.pUserData = info.debug_user_data_pointer;
        pNext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&messengerCreateInfo));
    }

    VkValidationFeaturesEXT features{};
    if (info.enabled_validation_features.size() != 0 || info.disabled_validation_features.size()) {
        features.sType = VK_STRUCTURE_TYPE_VALIDATION_FEATURES_EXT;
        features.pNext = nullptr;
        features.enabledValidationFeatureCount = static_cast<uint32_t>(info.enabled_validation_features.size());
        features.pEnabledValidationFeatures = info.enabled_validation_features.data();
        features.disabledValidationFeatureCount = static_cast<uint32_t>(info.disabled_validation_features.size());
        features.pDisabledValidationFeatures = info.disabled_validation_features.data();
        pNext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&features));
    }

    VkValidationFlagsEXT checks{};
    if (info.disabled_validation_checks.size() != 0) {
        checks.sType = VK_STRUCTURE_TYPE_VALIDATION_FLAGS_EXT;
        checks.pNext = nullptr;
        checks.disabledValidationCheckCount = static_cast<uint32_t>(info.disabled_validation_checks.size());
        checks.pDisabledValidationChecks = info.disabled_validation_checks.data();
        pNext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&checks));
    }

    VkInstanceCreateInfo instance_create_info = {};
    instance_create_info.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    detail::setup_pNext_chain(instance_create_info, pNext_chain);
#if !defined(NDEBUG)
    for (auto& node : pNext_chain) {
        assert(node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO);
    }
#endif
    instance_create_info.flags = info.flags;
    instance_create_info.pApplicationInfo = &app_info;
    instance_create_info.enabledExtensionCount = static_cast<uint32_t>(extensions.size());
    instance_create_info.ppEnabledExtensionNames = extensions.data();
    instance_create_info.enabledLayerCount = static_cast<uint32_t>(layers.size());
    instance_create_info.ppEnabledLayerNames = layers.data();
#if defined(VK_KHR_portability_enumeration)
    if (portability_enumeration_support) {
        instance_create_info.flags |= VK_INSTANCE_CREATE_ENUMERATE_PORTABILITY_BIT_KHR;
    }
#endif

    Instance instance;
    VkResult res =
        detail::vulkan_functions().fp_vkCreateInstance(&instance_create_info, info.allocation_callbacks, &instance.instance);
    if (res != VK_SUCCESS) return Result<Instance>(InstanceError::failed_create_instance, res);

    detail::vulkan_functions().init_instance_funcs(instance.instance);

    if (info.use_debug_messenger) {
        res = create_debug_utils_messenger(instance.instance,
            info.debug_callback,
            info.debug_message_severity,
            info.debug_message_type,
            info.debug_user_data_pointer,
            &instance.debug_messenger,
            info.allocation_callbacks);
        if (res != VK_SUCCESS) {
            return Result<Instance>(InstanceError::failed_create_debug_messenger, res);
        }
    }

    instance.headless = info.headless_context;
    instance.properties2_ext_enabled = properties2_ext_enabled;
    instance.allocation_callbacks = info.allocation_callbacks;
    instance.instance_version = instance_version;
    instance.api_version = api_version;
    instance.fp_vkGetInstanceProcAddr = detail::vulkan_functions().ptr_vkGetInstanceProcAddr;
    instance.fp_vkGetDeviceProcAddr = detail::vulkan_functions().fp_vkGetDeviceProcAddr;
    return instance;
}